

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_decode_status(int *pstatus,char *s,size_t len)

{
  CURLcode CVar1;
  int iVar2;
  long lVar3;
  
  CVar1 = CURLE_BAD_FUNCTION_ARGUMENT;
  if (len == 3) {
    lVar3 = 0;
    iVar2 = 0;
    do {
      if ((byte)(s[lVar3] - 0x3aU) < 0xf6) goto LAB_00136677;
      iVar2 = (uint)(byte)s[lVar3] + iVar2 * 10 + -0x30;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    CVar1 = CURLE_OK;
  }
  else {
LAB_00136677:
    iVar2 = -1;
  }
  *pstatus = iVar2;
  return CVar1;
}

Assistant:

CURLcode Curl_http_decode_status(int *pstatus, const char *s, size_t len)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;
  int status = 0;
  int i;

  if(len != 3)
    goto out;

  for(i = 0; i < 3; ++i) {
    char c = s[i];

    if(c < '0' || c > '9')
      goto out;

    status *= 10;
    status += c - '0';
  }
  result = CURLE_OK;
out:
  *pstatus = result ? -1 : status;
  return result;
}